

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O1

void Zyx_ManExactSynthesis(Bmc_EsPar_t *pPars)

{
  ulong *puVar1;
  Bmc_EsPar_t *pBVar2;
  Vec_Wrd_t *pVVar3;
  word *pwVar4;
  long lVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  Zyx_Man_t *p;
  long lVar14;
  ulong uVar15;
  long lVar16;
  timespec *pTruth_00;
  long lVar17;
  uint uVar18;
  word *pwVar19;
  char *pcVar20;
  ulong uVar21;
  uint uVar22;
  int (*paiVar23) [32];
  bool bVar24;
  timespec ts_2;
  word pTruth [16];
  uint local_128;
  int local_114;
  long local_108;
  long local_100;
  timespec local_f8;
  long local_e8;
  int (*local_c8) [32];
  int (*local_c0) [32];
  timespec local_b8 [8];
  
  iVar7 = clock_gettime(3,local_b8);
  local_100 = -1;
  local_108 = -1;
  if (-1 < iVar7) {
    local_108 = local_b8[0].tv_nsec / 1000 +
                CONCAT71(local_b8[0].tv_sec._1_7_,(byte)local_b8[0].tv_sec) * 1000000;
  }
  iVar7 = clock_gettime(3,local_b8);
  if (-1 < iVar7) {
    local_100 = local_b8[0].tv_nsec / 1000 +
                CONCAT71(local_b8[0].tv_sec._1_7_,(byte)local_b8[0].tv_sec) * 1000000;
  }
  local_114 = 0;
  if ((pPars->fMajority == 0) &&
     (Abc_TtReadHex((word *)local_b8,pPars->pTtStr), ((byte)local_b8[0].tv_sec & 1) != 0)) {
    local_114 = 1;
    uVar13 = (ulong)(uint)(1 << ((char)pPars->nVars - 6U & 0x1f));
    if (pPars->nVars < 7) {
      uVar13 = 1;
    }
    if (0 < (int)uVar13) {
      uVar15 = 0;
      do {
        (&local_b8[0].tv_sec)[uVar15] = ~(&local_b8[0].tv_sec)[uVar15];
        uVar15 = uVar15 + 1;
      } while (uVar13 != uVar15);
    }
  }
  if (10 < pPars->nVars) {
    __assert_fail("pPars->nVars <= 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                  ,0x4f8,"void Zyx_ManExactSynthesis(Bmc_EsPar_t *)");
  }
  if (6 < pPars->nLutSize) {
    __assert_fail("pPars->nLutSize <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                  ,0x4f9,"void Zyx_ManExactSynthesis(Bmc_EsPar_t *)");
  }
  pTruth_00 = local_b8;
  if (pPars->fMajority != 0) {
    pTruth_00 = (timespec *)0x0;
  }
  p = Zyx_ManAlloc(pPars,(word *)pTruth_00);
  pBVar2 = p->pPars;
  pcVar20 = "MAJ-gates";
  if (pBVar2->fMajority == 0) {
    pcVar20 = "LUTs";
  }
  printf("Running exact synthesis for %d-input function with %d %d-input %s...\n",
         (ulong)(uint)pBVar2->nVars,(ulong)(uint)pBVar2->nNodes,(ulong)(uint)pBVar2->nLutSize,
         pcVar20);
  local_c8 = p->pFanins;
  uVar12 = 0;
  uVar22 = 0;
  uVar13 = 0;
  local_128 = 0;
LAB_005ad57d:
  do {
    iVar10 = (int)uVar13;
    iVar7 = bmcg_sat_solver_solve(p->pSat,(int *)0x0,0);
    if (iVar7 != 1) break;
    iVar8 = Zyx_ManAddCnfLazyTopo(p);
    iVar7 = 1;
    if (iVar8 == 0) {
LAB_005ad5c0:
      bVar24 = false;
    }
    else {
      if (iVar8 == -1) {
        puts("Became UNSAT after adding lazy constraints.");
        iVar7 = -1;
        goto LAB_005ad5c0;
      }
      uVar12 = uVar12 + iVar8;
      bVar24 = true;
    }
  } while (bVar24);
  if (iVar7 == -1) goto LAB_005add8a;
  iVar7 = p->pPars->nVars;
  lVar17 = (long)iVar7;
  iVar10 = p->nObjs;
  if (iVar7 < iVar10) {
    paiVar23 = local_c8 + lVar17;
    do {
      iVar7 = (int)lVar17;
      uVar9 = Zyx_ManCollectFanins(p,iVar7);
      pBVar2 = p->pPars;
      uVar18 = pBVar2->nLutSize;
      if (uVar9 != uVar18) {
        __assert_fail("nFanins == p->pPars->nLutSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                      ,0x4b5,"int Zyx_ManEval(Zyx_Man_t *)");
      }
      if (0 < (int)uVar18) {
        pVVar3 = p->vInfo;
        iVar10 = p->nWords;
        uVar13 = 0;
        do {
          uVar9 = (*paiVar23)[uVar13] * iVar10;
          if (((int)uVar9 < 0) || (pVVar3->nSize <= (int)uVar9)) goto LAB_005adfad;
          (&local_f8.tv_sec)[uVar13] = (__time_t)(pVVar3->pArray + uVar9);
          uVar13 = uVar13 + 1;
        } while (uVar18 != uVar13);
      }
      uVar18 = p->nWords;
      uVar9 = uVar18 * iVar7;
      pVVar3 = p->vInfo;
      local_c0 = paiVar23;
      if (pBVar2->fMajority == 0) {
        if (((int)uVar9 < 0) || (pVVar3->nSize <= (int)uVar9)) goto LAB_005adfad;
        if (0 < (int)uVar18) {
          memset(pVVar3->pArray + uVar9,0,(ulong)uVar18 << 3);
        }
        iVar10 = p->LutMask;
        if (0 < iVar10) {
          uVar18 = 1;
          do {
            iVar10 = bmcg_sat_solver_read_cex_varvalue
                               (p->pSat,(iVar7 - p->pPars->nVars) * (iVar10 + 1) + uVar18);
            if (iVar10 != 0) {
              uVar9 = p->nWords;
              uVar13 = (ulong)uVar9;
              uVar11 = p->nObjs * uVar9;
              if ((int)uVar11 < 0) goto LAB_005adfad;
              iVar10 = p->vInfo->nSize;
              if (iVar10 <= (int)uVar11) goto LAB_005adfad;
              pwVar4 = p->vInfo->pArray;
              pwVar19 = pwVar4 + uVar11;
              if (0 < (int)uVar9) {
                memset(pwVar19,0xff,uVar13 * 8);
              }
              lVar14 = (long)p->pPars->nLutSize;
              if (0 < lVar14) {
                lVar16 = 0;
                do {
                  lVar5 = (&local_f8.tv_sec)[lVar16];
                  if ((uVar18 >> ((uint)lVar16 & 0x1f) & 1) == 0) {
                    if (0 < (int)uVar9) {
                      uVar15 = 0;
                      do {
                        pwVar19[uVar15] = pwVar19[uVar15] & ~*(ulong *)(lVar5 + uVar15 * 8);
                        uVar15 = uVar15 + 1;
                      } while (uVar13 != uVar15);
                    }
                  }
                  else if (0 < (int)uVar9) {
                    uVar15 = 0;
                    do {
                      pwVar19[uVar15] = pwVar19[uVar15] & *(ulong *)(lVar5 + uVar15 * 8);
                      uVar15 = uVar15 + 1;
                    } while (uVar13 != uVar15);
                  }
                  lVar16 = lVar16 + 1;
                } while (lVar16 != lVar14);
              }
              if (((int)(uVar9 * iVar7) < 0) || (iVar10 <= (int)(uVar9 * iVar7))) goto LAB_005adfad;
              if (0 < (int)uVar9) {
                uVar15 = 0;
                do {
                  puVar1 = pwVar4 + iVar7 * uVar9 + uVar15;
                  *puVar1 = *puVar1 | pwVar19[uVar15];
                  uVar15 = uVar15 + 1;
                } while (uVar13 != uVar15);
              }
            }
            iVar10 = p->LutMask;
            bVar24 = (int)uVar18 < iVar10;
            uVar18 = uVar18 + 1;
          } while (bVar24);
        }
      }
      else {
        if (((int)uVar9 < 0) || (pVVar3->nSize <= (int)uVar9)) goto LAB_005adfad;
        if (0 < (int)uVar18) {
          pwVar19 = pVVar3->pArray;
          uVar13 = 0;
          do {
            uVar15 = *(ulong *)(local_f8.tv_nsec + uVar13 * 8);
            uVar21 = *(ulong *)(local_e8 + uVar13 * 8);
            pwVar19[uVar18 * iVar7 + uVar13] =
                 uVar21 & uVar15 |
                 (uVar21 | uVar15) &
                 *(ulong *)(CONCAT44(local_f8.tv_sec._4_4_,(int)local_f8.tv_sec) + uVar13 * 8);
            uVar13 = uVar13 + 1;
          } while (uVar18 != uVar13);
        }
      }
      lVar17 = lVar17 + 1;
      iVar10 = p->nObjs;
      paiVar23 = local_c0 + 1;
    } while (lVar17 < iVar10);
  }
  iVar7 = p->pPars->fMajority;
  if (iVar7 == 0) {
    pwVar19 = p->pTruth;
  }
  else {
    uVar18 = p->nWords * iVar10;
    if (((int)uVar18 < 0) || (p->vInfo->nSize <= (int)uVar18)) goto LAB_005adfad;
    pwVar19 = p->vInfo->pArray + uVar18;
  }
  if (iVar7 == 0) {
    uVar18 = (iVar10 + -1) * p->nWords;
    if (((int)uVar18 < 0) || (p->vInfo->nSize <= (int)uVar18)) {
LAB_005adfad:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                    ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
    }
    iVar7 = p->pPars->nVars;
    bVar6 = (byte)iVar7;
    uVar9 = 1 << (bVar6 - 6 & 0x1f);
    if (iVar7 < 7) {
      uVar9 = 1;
    }
    uVar13 = 0xffffffff;
    if (0 < (int)uVar9) {
      iVar7 = 0;
      uVar15 = 0;
      do {
        uVar21 = p->vInfo->pArray[uVar18 + uVar15];
        if (uVar21 != pwVar19[uVar15]) {
          uVar21 = pwVar19[uVar15] ^ uVar21;
          bVar24 = (int)uVar21 == 0;
          uVar13 = uVar21 >> 0x20;
          if (!bVar24) {
            uVar13 = uVar21;
          }
          iVar8 = (uint)bVar24 * 0x20;
          iVar10 = iVar8 + 0x10;
          uVar15 = uVar13 >> 0x10;
          if ((short)uVar13 != 0) {
            iVar10 = iVar8;
            uVar15 = uVar13;
          }
          iVar8 = iVar10 + 8;
          uVar13 = uVar15 >> 8;
          if ((char)uVar15 != '\0') {
            iVar8 = iVar10;
            uVar13 = uVar15;
          }
          iVar10 = iVar8 + 4;
          uVar15 = uVar13 >> 4;
          if ((uVar13 & 0xf) != 0) {
            iVar10 = iVar8;
            uVar15 = uVar13;
          }
          uVar18 = (uint)(uVar15 >> 2) & 0x3fffffff;
          iVar8 = iVar10 + 2;
          if ((uVar15 & 3) != 0) {
            uVar18 = (uint)uVar15;
            iVar8 = iVar10;
          }
          uVar13 = (ulong)(((~uVar18 & 1) + iVar8) - iVar7);
          break;
        }
        uVar15 = uVar15 + 1;
        iVar7 = iVar7 + -0x40;
      } while (uVar9 != uVar15);
    }
    if (1 << (bVar6 & 0x1f) <= (int)uVar13) {
      __assert_fail("iMint < (1 << p->pPars->nVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                    ,0x4d7,"int Zyx_ManEval(Zyx_Man_t *)");
    }
  }
  else {
    uVar18 = p->vMidMints->nSize;
    if (0 < (int)uVar18) {
      uVar9 = (iVar10 + -1) * p->nWords;
      if (((int)uVar9 < 0) || (p->vInfo->nSize <= (int)uVar9)) goto LAB_005adfad;
      uVar15 = 0;
      do {
        uVar11 = p->vMidMints->pArray[uVar15];
        uVar13 = (ulong)uVar11;
        lVar17 = (long)((int)uVar11 >> 6);
        if (((p->vInfo->pArray[(ulong)uVar9 + lVar17] ^ pwVar19[lVar17]) >> (uVar13 & 0x3f) & 1) !=
            0) goto LAB_005ad9d2;
        uVar15 = uVar15 + 1;
      } while (uVar18 != uVar15);
    }
    uVar13 = 0xffffffff;
  }
LAB_005ad9d2:
  iVar10 = (int)uVar13;
  if (iVar10 == -1) {
    iVar10 = -1;
    if (pPars->fEnumSols == 0) goto LAB_005add8a;
    if (pPars->fVerbose != 0) {
      iVar7 = clock_gettime(3,&local_f8);
      local_100 = -1;
      lVar17 = -1;
      if (-1 < iVar7) {
        lVar17 = local_f8.tv_nsec / 1000 +
                 CONCAT44(local_f8.tv_sec._4_4_,(int)local_f8.tv_sec) * 1000000;
      }
      local_f8.tv_sec._0_4_ = -1;
      printf("Iter %6d : ",(ulong)local_128);
      Extra_PrintBinary(_stdout,(uint *)&local_f8,p->pPars->nVars);
      printf("  ");
      uVar18 = bmcg_sat_solver_clausenum(p->pSat);
      printf("Cla =%9d  ",(ulong)uVar18);
      printf("Lazy =%6d  ",(ulong)uVar12);
      uVar18 = bmcg_sat_solver_conflictnum(p->pSat);
      iVar7 = 0x9fdb8a;
      printf("Conf =%9d  ",(ulong)uVar18);
      Abc_Print(iVar7,"%s =","Time");
      Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar17 - local_108) / 1000000.0);
      iVar7 = clock_gettime(3,&local_f8);
      if (-1 < iVar7) {
        local_100 = local_f8.tv_nsec / 1000 +
                    CONCAT44(local_f8.tv_sec._4_4_,(int)local_f8.tv_sec) * 1000000;
      }
    }
    uVar18 = uVar22 + 1;
    Zyx_ManPrintSolution(p,local_114,(uint)(uVar22 == 0));
    iVar7 = Zyx_ManAddCnfBlockSolution(p);
    uVar22 = uVar18;
    if (iVar7 == 0) goto LAB_005add8a;
  }
  else {
    if (pPars->fUseIncr == 0) {
      iVar7 = Zyx_ManAddCnfLazyFunc(p,iVar10);
    }
    else {
      iVar7 = Zyx_ManAddCnfLazyFunc2(p,iVar10);
    }
    if (iVar7 == 0) {
      printf("Became UNSAT after adding constraints for minterm %d\n",uVar13);
LAB_005add8a:
      if (pPars->fVerbose != 0) {
        iVar7 = clock_gettime(3,&local_f8);
        if (iVar7 < 0) {
          lVar17 = -1;
        }
        else {
          lVar17 = local_f8.tv_nsec / 1000 +
                   CONCAT44(local_f8.tv_sec._4_4_,(int)local_f8.tv_sec) * 1000000;
        }
        local_f8.tv_sec._0_4_ = iVar10;
        printf("Iter %6d : ",(ulong)local_128);
        Extra_PrintBinary(_stdout,(uint *)&local_f8,p->pPars->nVars);
        printf("  ");
        uVar18 = bmcg_sat_solver_clausenum(p->pSat);
        printf("Cla =%9d  ",(ulong)uVar18);
        printf("Lazy =%6d  ",(ulong)uVar12);
        uVar12 = bmcg_sat_solver_conflictnum(p->pSat);
        iVar7 = 0x9fdb8a;
        printf("Conf =%9d  ",(ulong)uVar12);
        Abc_Print(iVar7,"%s =","Time");
        Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar17 - local_108) / 1000000.0);
      }
      if (pPars->fEnumSols == 0) {
        if (iVar10 == -1) {
          Zyx_ManPrintSolution(p,local_114,1);
        }
        else {
          puts("The problem has no solution.");
        }
      }
      else {
        printf("Finished enumerating %d solutions.\n",(ulong)uVar22);
      }
      printf("Added = %d.  Tried = %d.  ",(ulong)(uint)p->nUsed[1],(ulong)(uint)p->nUsed[0]);
      iVar10 = 3;
      iVar7 = clock_gettime(3,&local_f8);
      if (iVar7 < 0) {
        lVar17 = -1;
      }
      else {
        lVar17 = local_f8.tv_nsec / 1000 +
                 CONCAT44(local_f8.tv_sec._4_4_,(int)local_f8.tv_sec) * 1000000;
      }
      Abc_Print(iVar10,"%s =","Total runtime");
      Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar17 - local_108) / 1000000.0);
      Zyx_ManFree(p);
      return;
    }
    iVar7 = bmcg_sat_solver_solve(p->pSat,(int *)0x0,0);
    if ((pPars->fVerbose != 0) && ((pPars->fUseIncr == 0 || (local_128 == (local_128 / 100) * 100)))
       ) {
      iVar8 = clock_gettime(3,&local_f8);
      lVar17 = -1;
      if (-1 < iVar8) {
        lVar17 = local_f8.tv_nsec / 1000 +
                 CONCAT44(local_f8.tv_sec._4_4_,(int)local_f8.tv_sec) * 1000000;
      }
      local_f8.tv_sec._0_4_ = iVar10;
      printf("Iter %6d : ",(ulong)local_128);
      Extra_PrintBinary(_stdout,(uint *)&local_f8,p->pPars->nVars);
      printf("  ");
      uVar18 = bmcg_sat_solver_clausenum(p->pSat);
      printf("Cla =%9d  ",(ulong)uVar18);
      printf("Lazy =%6d  ",(ulong)uVar12);
      uVar18 = bmcg_sat_solver_conflictnum(p->pSat);
      iVar8 = 0x9fdb8a;
      printf("Conf =%9d  ",(ulong)uVar18);
      Abc_Print(iVar8,"%s =","Time");
      Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar17 - local_100) / 1000000.0);
      iVar8 = clock_gettime(3,&local_f8);
      local_100 = -1;
      if (-1 < iVar8) {
        local_100 = local_f8.tv_nsec / 1000 +
                    CONCAT44(local_f8.tv_sec._4_4_,(int)local_f8.tv_sec) * 1000000;
      }
    }
    if (iVar7 == -1) goto LAB_005add8a;
  }
  local_128 = local_128 + 1;
  goto LAB_005ad57d;
}

Assistant:

void Zyx_ManExactSynthesis( Bmc_EsPar_t * pPars )
{
    int status, Iter, iMint = 0, fCompl = 0, nLazyAll = 0, nSols = 0;
    abctime clkTotal = Abc_Clock(), clk = Abc_Clock();  Zyx_Man_t * p; 
    word pTruth[16]; 
    if ( !pPars->fMajority )
    {
        Abc_TtReadHex( pTruth, pPars->pTtStr );
        if ( pTruth[0] & 1 ) { fCompl = 1; Abc_TtNot( pTruth, Abc_TtWordNum(pPars->nVars) ); }
    }
    assert( pPars->nVars <= 10 );
    assert( pPars->nLutSize <= 6 );
    p = Zyx_ManAlloc( pPars, pPars->fMajority ? NULL : pTruth );
    printf( "Running exact synthesis for %d-input function with %d %d-input %s...\n", 
        p->pPars->nVars, p->pPars->nNodes, p->pPars->nLutSize, p->pPars->fMajority ? "MAJ-gates" : "LUTs" );
    for ( Iter = 0 ; ; Iter++ )
    {
        while ( (status = bmcg_sat_solver_solve(p->pSat, NULL, 0)) == GLUCOSE_SAT )
        {
            int nLazy = Zyx_ManAddCnfLazyTopo( p );
            if ( nLazy == -1 )
            {
                printf( "Became UNSAT after adding lazy constraints.\n" );
                status = GLUCOSE_UNSAT;
                break;
            }
            //printf( "Added %d lazy constraints.\n\n", nLazy );
            if ( nLazy == 0 )
                break;
            nLazyAll += nLazy;
        }
        if ( status == GLUCOSE_UNSAT )
            break;
        // find mismatch
        iMint = Zyx_ManEval( p );
        if ( iMint == -1 )
        {
            if ( pPars->fEnumSols )
            {
                nSols++;
                if ( pPars->fVerbose )
                {
                    Zyx_ManPrint( p, Iter, iMint, nLazyAll, Abc_Clock() - clkTotal );
                    clk = Abc_Clock();
                }
                Zyx_ManPrintSolution( p, fCompl, nSols==1 );
                if ( !Zyx_ManAddCnfBlockSolution( p ) )
                {
                    status = GLUCOSE_UNSAT;
                    break;
                }
                continue;
            }
            else
                break;
        }
        if ( pPars->fUseIncr ? !Zyx_ManAddCnfLazyFunc2(p, iMint) : !Zyx_ManAddCnfLazyFunc(p, iMint) )
        {
            printf( "Became UNSAT after adding constraints for minterm %d\n", iMint );
            status = GLUCOSE_UNSAT;
            break;
        }
        status = bmcg_sat_solver_solve( p->pSat, NULL, 0 );
        if ( pPars->fVerbose && (!pPars->fUseIncr || Iter % 100 == 0) )
        {
            Zyx_ManPrint( p, Iter, iMint, nLazyAll, Abc_Clock() - clk );
            clk = Abc_Clock();
        }
        if ( status == GLUCOSE_UNSAT )
            break;
    }
    if ( pPars->fVerbose )
        Zyx_ManPrint( p, Iter, iMint, nLazyAll, Abc_Clock() - clkTotal );
    if ( pPars->fEnumSols )
        printf( "Finished enumerating %d solutions.\n", nSols );
    else if ( iMint == -1 )
        Zyx_ManPrintSolution( p, fCompl, 1 );
    else
        printf( "The problem has no solution.\n" );
    //Zyx_ManEvalStats( p );
    printf( "Added = %d.  Tried = %d.  ", p->nUsed[1], p->nUsed[0] );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
    Zyx_ManFree( p );
}